

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mtc0_config5_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  target_ulong_conflict tVar1;
  uint uVar2;
  
  uVar2 = (arg1 ^ env->CP0_Config5) & env->CP0_Config5_rw_bitmask ^ env->CP0_Config5;
  env->CP0_Config5 = uVar2;
  tVar1 = 0;
  if (((uVar2 >> 0x11 & 1) == 0) && (tVar1 = 0x3ff, (env->CP0_Config4 & 0x10000000) == 0)) {
    tVar1 = 0xff;
  }
  env->CP0_EntryHi_ASID_mask = tVar1;
  compute_hflags(env);
  return;
}

Assistant:

void helper_mtc0_config5(CPUMIPSState *env, target_ulong arg1)
{
    env->CP0_Config5 = (env->CP0_Config5 & (~env->CP0_Config5_rw_bitmask)) |
                       (arg1 & env->CP0_Config5_rw_bitmask);
    env->CP0_EntryHi_ASID_mask = (env->CP0_Config5 & (1 << CP0C5_MI)) ?
            0x0 : (env->CP0_Config4 & (1 << CP0C4_AE)) ? 0x3ff : 0xff;
    compute_hflags(env);
}